

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

llama_sampler *
llama_sampler_init_penalties
          (int32_t penalty_last_n,float penalty_repeat,float penalty_freq,float penalty_present)

{
  undefined4 *puVar1;
  llama_sampler *plVar2;
  size_type __n;
  allocator_type local_1d;
  float local_1c;
  float local_18;
  float local_14;
  
  __n = 0;
  if (0 < penalty_last_n) {
    __n = (size_type)(uint)penalty_last_n;
  }
  local_1c = penalty_repeat;
  local_18 = penalty_freq;
  local_14 = penalty_present;
  puVar1 = (undefined4 *)operator_new(0x80);
  *puVar1 = (int)__n;
  puVar1[1] = local_1c;
  puVar1[2] = local_18;
  puVar1[3] = local_14;
  *(size_type *)(puVar1 + 4) = __n;
  *(undefined8 *)(puVar1 + 6) = 0;
  *(undefined8 *)(puVar1 + 8) = 0;
  *(undefined8 *)(puVar1 + 10) = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(puVar1 + 0xc),__n,&local_1d);
  *(undefined8 *)(puVar1 + 0x1a) = 0;
  *(undefined4 **)(puVar1 + 0x12) = puVar1 + 0x1e;
  *(undefined8 *)(puVar1 + 0x14) = 1;
  *(undefined8 *)(puVar1 + 0x16) = 0;
  *(undefined8 *)(puVar1 + 0x18) = 0;
  puVar1[0x1a] = 0x3f800000;
  *(undefined8 *)(puVar1 + 0x1c) = 0;
  *(undefined8 *)(puVar1 + 0x1e) = 0;
  plVar2 = (llama_sampler *)operator_new(0x10);
  plVar2->iface = &llama_sampler_penalties_i;
  plVar2->ctx = puVar1;
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_penalties(
        int32_t penalty_last_n,
        float penalty_repeat,
        float penalty_freq,
        float penalty_present) {
    penalty_last_n = std::max(penalty_last_n, 0);

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_penalties_i,
        /* .ctx   = */ new llama_sampler_penalties {
            /* .penalty_last_n  = */ penalty_last_n,
            /* .penalty_repeat  = */ penalty_repeat,
            /* .penalty_freq    = */ penalty_freq,
            /* .penalty_present = */ penalty_present,
            /* .prev            = */ ring_buffer<llama_token>(penalty_last_n),
            /* .token_count     = */ {},
        }
    );
}